

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreaterExpression.hpp
# Opt level: O0

string * __thiscall
Kandinsky::GreaterExpression::toString_abi_cxx11_(GreaterExpression *this,bool evaluate)

{
  element_type *peVar1;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11fb94);
  (*peVar1->_vptr_BaseExpression[5])(local_98,peVar1,(ulong)(local_11 & 1));
  std::operator+((char *)in_RSI,in_RDI);
  std::operator+(in_RSI,(char *)in_RDI);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11fbf6);
  (*peVar1->_vptr_BaseExpression[5])(local_c8,peVar1,(ulong)(local_11 & 1));
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(in_RSI,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  return in_RDI;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "(" + m_arg1->toString(evaluate) + " > " + m_arg2->toString(evaluate) + ")";
        }